

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O2

DataSegment * __thiscall wasm::Module::getDataSegment(Module *this,Name name)

{
  mapped_type pDVar1;
  mapped_type *ppDVar2;
  string *in_R8;
  Name name_00;
  string local_50 [39];
  allocator<char> local_29;
  
  name_00.super_IString.str._M_len = name.super_IString.str._M_str;
  std::__cxx11::string::string<std::allocator<char>>(local_50,"getDataSegment",&local_29);
  name_00.super_IString.str._M_str = (char *)local_50;
  ppDVar2 = getModuleElement<std::unordered_map<wasm::Name,wasm::DataSegment*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::DataSegment*>>>>
                      ((wasm *)&this->dataSegmentsMap,name.super_IString.str._M_len,name_00,in_R8);
  pDVar1 = *ppDVar2;
  std::__cxx11::string::~string(local_50);
  return pDVar1;
}

Assistant:

DataSegment* Module::getDataSegment(Name name) {
  return getModuleElement(dataSegmentsMap, name, "getDataSegment");
}